

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O2

void __thiscall
duckdb::AsOfProbeBuffer::GetData(AsOfProbeBuffer *this,ExecutionContext *context,DataChunk *chunk)

{
  byte bVar1;
  bool bVar2;
  NotImplementedException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->fetch_next_left == false) {
    this->fetch_next_left = true;
    if ((this->left_outer).enabled == true) {
      OuterJoinMarker::ConstructLeftJoinResult(&this->left_outer,&this->lhs_payload,chunk);
      if ((this->left_outer).enabled == true) {
        switchD_004a0b15::default
                  ((this->left_outer).found_match.
                   super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
                   super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                   super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                   super__Head_base<0UL,_bool_*,_false>._M_head_impl,0,(this->left_outer).count);
        return;
      }
    }
  }
  else {
    bVar2 = NextLeft(this);
    if (bVar2) {
      bVar1 = (this->op->super_PhysicalComparisonJoin).super_PhysicalJoin.
              super_CachingPhysicalOperator.field_0x81;
      if (bVar1 - 1 < 4) {
        ResolveComplexJoin(this,context,chunk);
        return;
      }
      if (bVar1 - 5 < 3) {
        ResolveSimpleJoin(this,context,chunk);
        return;
      }
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Unimplemented type for as-of join!",&local_39);
      NotImplementedException::NotImplementedException(this_00,&local_38);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void AsOfProbeBuffer::GetData(ExecutionContext &context, DataChunk &chunk) {
	//	Handle dangling left join results from current chunk
	if (!fetch_next_left) {
		fetch_next_left = true;
		if (left_outer.Enabled()) {
			// left join: before we move to the next chunk, see if we need to output any vectors that didn't
			// have a match found
			left_outer.ConstructLeftJoinResult(lhs_payload, chunk);
			left_outer.Reset();
		}
		return;
	}

	//	Stop if there is no more data
	if (!NextLeft()) {
		return;
	}

	switch (op.join_type) {
	case JoinType::SEMI:
	case JoinType::ANTI:
	case JoinType::MARK:
		// simple joins can have max STANDARD_VECTOR_SIZE matches per chunk
		ResolveSimpleJoin(context, chunk);
		break;
	case JoinType::LEFT:
	case JoinType::INNER:
	case JoinType::RIGHT:
	case JoinType::OUTER:
		ResolveComplexJoin(context, chunk);
		break;
	default:
		throw NotImplementedException("Unimplemented type for as-of join!");
	}
}